

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

bool embree::sse2::ConeCurveMiMBIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  Geometry *pGVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  byte bVar22;
  long lVar23;
  RTCIntersectArguments *pRVar24;
  RTCFilterFunctionN p_Var25;
  RTCRayN *pRVar26;
  long lVar27;
  bool bVar28;
  int iVar29;
  long lVar30;
  Scene *pSVar31;
  long lVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  float fVar38;
  float fVar39;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar50;
  float fVar57;
  undefined1 auVar51 [16];
  uint uVar58;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar59;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar96;
  uint uVar97;
  float fVar102;
  float fVar104;
  undefined1 auVar98 [16];
  float fVar106;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint uVar103;
  uint uVar105;
  uint uVar107;
  undefined1 auVar101 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  uint uVar111;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  uint uVar119;
  uint uVar123;
  uint uVar127;
  undefined1 auVar115 [16];
  float fVar128;
  float fVar129;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar138;
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar140 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar152 [16];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  Scene *local_300;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 local_2b8;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  uint local_148 [4];
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  local_300 = context->scene;
  local_2b8 = (ulong)line->sharedGeomID;
  uVar34 = (line->v0).field_0.i[0];
  pGVar17 = (local_300->geometries).items[local_2b8].ptr;
  fVar49 = pGVar17->fnumTimeSegments;
  fVar38 = (pGVar17->time_range).lower;
  fVar38 = floorf(((*(float *)(ray + k * 4 + 0x70) - fVar38) /
                  ((pGVar17->time_range).upper - fVar38)) * fVar49);
  fVar49 = fVar49 + -1.0;
  if (fVar49 <= fVar38) {
    fVar38 = fVar49;
  }
  fVar49 = 0.0;
  if (0.0 <= fVar38) {
    fVar49 = fVar38;
  }
  lVar30 = *(long *)&pGVar17[3].time_range.upper;
  lVar32 = (long)(int)fVar49 * 0x38;
  lVar23 = *(long *)(lVar30 + lVar32);
  lVar27 = *(long *)(lVar30 + 0x10 + lVar32);
  pfVar1 = (float *)(lVar23 + lVar27 * (ulong)uVar34);
  uVar35 = (line->v0).field_0.i[1];
  pfVar2 = (float *)(lVar23 + lVar27 * (ulong)uVar35);
  uVar36 = (line->v0).field_0.i[2];
  pfVar3 = (float *)(lVar23 + lVar27 * (ulong)uVar36);
  uVar37 = (line->v0).field_0.i[3];
  pfVar4 = (float *)(lVar23 + lVar27 * (ulong)uVar37);
  puVar5 = (undefined8 *)(lVar23 + lVar27 * (ulong)(uVar34 + 1));
  uVar20 = *puVar5;
  uVar21 = puVar5[1];
  pfVar6 = (float *)(lVar23 + lVar27 * (ulong)(uVar35 + 1));
  pfVar7 = (float *)(lVar23 + lVar27 * (ulong)(uVar36 + 1));
  fVar49 = pfVar7[2];
  pfVar8 = (float *)(lVar23 + lVar27 * (ulong)(uVar37 + 1));
  lVar23 = *(long *)(lVar30 + 0x38 + lVar32);
  lVar30 = *(long *)(lVar30 + 0x48 + lVar32);
  pfVar9 = (float *)(lVar23 + (ulong)uVar34 * lVar30);
  pfVar10 = (float *)(lVar23 + (ulong)uVar35 * lVar30);
  pfVar11 = (float *)(lVar23 + (ulong)uVar36 * lVar30);
  pfVar12 = (float *)(lVar23 + (ulong)uVar37 * lVar30);
  pfVar13 = (float *)(lVar23 + (ulong)(uVar34 + 1) * lVar30);
  pfVar14 = (float *)(lVar23 + (ulong)(uVar36 + 1) * lVar30);
  local_338 = (float)uVar20;
  fStack_334 = (float)((ulong)uVar20 >> 0x20);
  fStack_330 = (float)uVar21;
  fStack_32c = (float)((ulong)uVar21 >> 0x20);
  pfVar15 = (float *)(lVar23 + (ulong)(uVar35 + 1) * lVar30);
  lVar30 = lVar30 * (ulong)(uVar37 + 1);
  pfVar16 = (float *)(lVar23 + lVar30);
  fVar38 = 1.0 - fVar49;
  fVar138 = *pfVar1 * fVar38 + *pfVar9 * fVar49;
  fVar141 = *pfVar2 * fVar38 + *pfVar10 * fVar49;
  fVar143 = *pfVar3 * fVar38 + *pfVar11 * fVar49;
  fVar145 = *pfVar4 * fVar38 + *pfVar12 * fVar49;
  fVar156 = pfVar1[1] * fVar38 + pfVar9[1] * fVar49;
  fVar158 = pfVar2[1] * fVar38 + pfVar10[1] * fVar49;
  fVar160 = pfVar3[1] * fVar38 + pfVar11[1] * fVar49;
  fVar162 = pfVar4[1] * fVar38 + pfVar12[1] * fVar49;
  fVar108 = pfVar1[2] * fVar38 + pfVar9[2] * fVar49;
  fVar116 = pfVar2[2] * fVar38 + pfVar10[2] * fVar49;
  fVar120 = pfVar3[2] * fVar38 + pfVar11[2] * fVar49;
  fVar124 = pfVar4[2] * fVar38 + pfVar12[2] * fVar49;
  fVar109 = pfVar1[3] * fVar38 + pfVar9[3] * fVar49;
  fVar117 = pfVar2[3] * fVar38 + pfVar10[3] * fVar49;
  fVar121 = pfVar3[3] * fVar38 + pfVar11[3] * fVar49;
  fVar125 = pfVar4[3] * fVar38 + pfVar12[3] * fVar49;
  fVar86 = local_338 * fVar38 + *pfVar13 * fVar49;
  fVar90 = *pfVar6 * fVar38 + *pfVar15 * fVar49;
  fVar92 = *pfVar7 * fVar38 + *pfVar14 * fVar49;
  fVar94 = *pfVar8 * fVar38 + *pfVar16 * fVar49;
  fVar74 = fStack_334 * fVar38 + pfVar13[1] * fVar49;
  fVar77 = pfVar6[1] * fVar38 + pfVar15[1] * fVar49;
  fVar80 = pfVar7[1] * fVar38 + pfVar14[1] * fVar49;
  fVar83 = pfVar8[1] * fVar38 + pfVar16[1] * fVar49;
  fStack_380 = (float)_local_388;
  fStack_37c = (float)((ulong)_local_388 >> 0x20);
  fVar164 = fStack_330 * fVar38 + pfVar13[2] * fVar49;
  fVar166 = pfVar6[2] * fVar38 + pfVar15[2] * fVar49;
  fVar168 = fStack_380 * fVar38 + pfVar14[2] * fVar49;
  fVar170 = fStack_37c * fVar38 + pfVar16[2] * fVar49;
  fVar68 = fVar38 * fStack_32c + fVar49 * pfVar13[3];
  fVar71 = fVar38 * pfVar6[3] + fVar49 * pfVar15[3];
  fVar72 = fVar38 * pfVar7[3] + fVar49 * pfVar14[3];
  fVar73 = fVar38 * pfVar8[3] + fVar49 * pfVar16[3];
  local_148[0] = (uint)(float)local_2b8;
  local_148[1] = (uint)(float)local_2b8;
  local_148[2] = (uint)(float)local_2b8;
  local_148[3] = (uint)(float)local_2b8;
  fVar49 = *(float *)(ray + k * 4 + 0x40);
  fStack_2b0 = *(float *)(ray + k * 4 + 0x50);
  fVar38 = *(float *)(ray + k * 4 + 0x60);
  auVar88._0_4_ = fVar49 * fVar49 + fStack_2b0 * fStack_2b0 + fVar38 * fVar38;
  auVar88._4_4_ = auVar88._0_4_;
  auVar88._8_4_ = auVar88._0_4_;
  auVar88._12_4_ = auVar88._0_4_;
  auVar98 = rcpps(ZEXT416((uint)(fVar38 * fVar38)),auVar88);
  fVar128 = auVar98._0_4_;
  fVar132 = auVar98._4_4_;
  fVar134 = auVar98._8_4_;
  fVar136 = auVar98._12_4_;
  fVar150 = *(float *)(ray + k * 4 + 0x10);
  fVar48 = *(float *)(ray + k * 4 + 0x20);
  fVar106 = *(float *)(ray + k * 4);
  fVar50 = (((fVar138 + fVar86) * 0.5 - fVar106) * fVar49 +
           ((fVar156 + fVar74) * 0.5 - fVar150) * fStack_2b0 +
           ((fVar108 + fVar164) * 0.5 - fVar48) * fVar38) *
           ((1.0 - auVar88._0_4_ * fVar128) * fVar128 + fVar128);
  fVar57 = (((fVar141 + fVar90) * 0.5 - fVar106) * fVar49 +
           ((fVar158 + fVar77) * 0.5 - fVar150) * fStack_2b0 +
           ((fVar116 + fVar166) * 0.5 - fVar48) * fVar38) *
           ((1.0 - auVar88._0_4_ * fVar132) * fVar132 + fVar132);
  fStack_2c0 = (((fVar143 + fVar92) * 0.5 - fVar106) * fVar49 +
               ((fVar160 + fVar80) * 0.5 - fVar150) * fStack_2b0 +
               ((fVar120 + fVar168) * 0.5 - fVar48) * fVar38) *
               ((1.0 - auVar88._0_4_ * fVar134) * fVar134 + fVar134);
  fStack_2bc = (((fVar145 + fVar94) * 0.5 - fVar106) * fVar49 +
               ((fVar162 + fVar83) * 0.5 - fVar150) * fStack_2b0 +
               ((fVar124 + fVar170) * 0.5 - fVar48) * fVar38) *
               ((1.0 - auVar88._0_4_ * fVar136) * fVar136 + fVar136);
  fVar96 = fVar49 * fVar50 + fVar106;
  fVar102 = fVar49 * fVar57 + fVar106;
  fVar104 = fVar49 * fStack_2c0 + fVar106;
  fVar106 = fVar49 * fStack_2bc + fVar106;
  fVar147 = fStack_2b0 * fVar50 + fVar150;
  fVar148 = fStack_2b0 * fVar57 + fVar150;
  fVar149 = fStack_2b0 * fStack_2c0 + fVar150;
  fVar150 = fStack_2b0 * fStack_2bc + fVar150;
  local_2c8 = (RayK<4> *)CONCAT44(fVar57,fVar50);
  fVar39 = fVar38 * fVar50 + fVar48;
  fVar46 = fVar38 * fVar57 + fVar48;
  fVar47 = fVar38 * fStack_2c0 + fVar48;
  fVar48 = fVar38 * fStack_2bc + fVar48;
  fVar151 = fVar86 - fVar138;
  fVar153 = fVar90 - fVar141;
  fVar154 = fVar92 - fVar143;
  fVar155 = fVar94 - fVar145;
  fVar138 = fVar96 - fVar138;
  fVar141 = fVar102 - fVar141;
  fVar143 = fVar104 - fVar143;
  fVar145 = fVar106 - fVar145;
  fVar128 = fVar74 - fVar156;
  fVar132 = fVar77 - fVar158;
  fVar134 = fVar80 - fVar160;
  fVar136 = fVar83 - fVar162;
  fVar156 = fVar147 - fVar156;
  fVar158 = fVar148 - fVar158;
  fVar160 = fVar149 - fVar160;
  fVar162 = fVar150 - fVar162;
  fVar75 = fVar164 - fVar108;
  fVar78 = fVar166 - fVar116;
  fVar81 = fVar168 - fVar120;
  fVar84 = fVar170 - fVar124;
  fVar108 = fVar39 - fVar108;
  fVar116 = fVar46 - fVar116;
  fVar120 = fVar47 - fVar120;
  fVar124 = fVar48 - fVar124;
  local_2d8._0_4_ = fVar151 * fVar151 + fVar128 * fVar128 + fVar75 * fVar75;
  local_2d8._4_4_ = fVar153 * fVar153 + fVar132 * fVar132 + fVar78 * fVar78;
  fStack_2d0 = fVar154 * fVar154 + fVar134 * fVar134 + fVar81 * fVar81;
  fStack_2cc = fVar155 * fVar155 + fVar136 * fVar136 + fVar84 * fVar84;
  fVar165 = fVar151 * fVar138 + fVar128 * fVar156 + fVar75 * fVar108;
  fVar167 = fVar153 * fVar141 + fVar132 * fVar158 + fVar78 * fVar116;
  fVar169 = fVar154 * fVar143 + fVar134 * fVar160 + fVar81 * fVar120;
  fVar171 = fVar155 * fVar145 + fVar136 * fVar162 + fVar84 * fVar124;
  fVar157 = fVar151 * fVar49 + fVar128 * fStack_2b0 + fVar75 * fVar38;
  fVar159 = fVar153 * fVar49 + fVar132 * fStack_2b0 + fVar78 * fVar38;
  fVar161 = fVar154 * fVar49 + fVar134 * fStack_2b0 + fVar81 * fVar38;
  fVar163 = fVar155 * fVar49 + fVar136 * fStack_2b0 + fVar84 * fVar38;
  local_2b8 = CONCAT44(fStack_2b0,fStack_2b0);
  fVar59 = fVar109 - fVar68;
  fVar65 = fVar117 - fVar71;
  fVar66 = fVar121 - fVar72;
  fVar67 = fVar125 - fVar73;
  fVar139 = fVar59 * fVar59 + (float)local_2d8._0_4_;
  fVar142 = fVar65 * fVar65 + (float)local_2d8._4_4_;
  fVar144 = fVar66 * fVar66 + fStack_2d0;
  fVar146 = fVar67 * fVar67 + fStack_2cc;
  fVar76 = (float)local_2d8._0_4_ * (float)local_2d8._0_4_;
  fVar79 = (float)local_2d8._4_4_ * (float)local_2d8._4_4_;
  fVar82 = fStack_2d0 * fStack_2d0;
  fVar85 = fStack_2cc * fStack_2cc;
  fVar110 = fVar157 * fVar157;
  fVar118 = fVar159 * fVar159;
  fVar122 = fVar161 * fVar161;
  fVar126 = fVar163 * fVar163;
  auVar98._0_4_ = fVar76 - fVar139 * fVar110;
  auVar98._4_4_ = fVar79 - fVar142 * fVar118;
  auVar98._8_4_ = fVar82 - fVar144 * fVar122;
  auVar98._12_4_ = fVar85 - fVar146 * fVar126;
  fVar87 = fVar109 * (float)local_2d8._0_4_;
  fVar91 = fVar117 * (float)local_2d8._4_4_;
  fVar93 = fVar121 * fStack_2d0;
  fVar95 = fVar125 * fStack_2cc;
  fVar172 = fVar59 * fVar157 * fVar87 +
            ((fVar49 * fVar138 + fStack_2b0 * fVar156 + fVar38 * fVar108) * fVar76 -
            fVar157 * fVar165 * fVar139);
  fVar173 = fVar65 * fVar159 * fVar91 +
            ((fVar49 * fVar141 + fStack_2b0 * fVar158 + fVar38 * fVar116) * fVar79 -
            fVar159 * fVar167 * fVar142);
  fVar174 = fVar66 * fVar161 * fVar93 +
            ((fVar49 * fVar143 + fStack_2b0 * fVar160 + fVar38 * fVar120) * fVar82 -
            fVar161 * fVar169 * fVar144);
  fVar175 = fVar67 * fVar163 * fVar95 +
            ((fVar49 * fVar145 + fStack_2b0 * fVar162 + fVar38 * fVar124) * fVar85 -
            fVar163 * fVar171 * fVar146);
  auVar113._0_4_ =
       fVar172 * fVar172 -
       (((fVar59 + fVar59) * fVar165 - fVar87) * fVar87 +
       ((fVar138 * fVar138 + fVar156 * fVar156 + fVar108 * fVar108) * fVar76 -
       fVar165 * fVar165 * fVar139)) * auVar98._0_4_;
  auVar113._4_4_ =
       fVar173 * fVar173 -
       (((fVar65 + fVar65) * fVar167 - fVar91) * fVar91 +
       ((fVar141 * fVar141 + fVar158 * fVar158 + fVar116 * fVar116) * fVar79 -
       fVar167 * fVar167 * fVar142)) * auVar98._4_4_;
  auVar113._8_4_ =
       fVar174 * fVar174 -
       (((fVar66 + fVar66) * fVar169 - fVar93) * fVar93 +
       ((fVar143 * fVar143 + fVar160 * fVar160 + fVar120 * fVar120) * fVar82 -
       fVar169 * fVar169 * fVar144)) * auVar98._8_4_;
  auVar113._12_4_ =
       fVar175 * fVar175 -
       (((fVar67 + fVar67) * fVar171 - fVar95) * fVar95 +
       ((fVar145 * fVar145 + fVar162 * fVar162 + fVar124 * fVar124) * fVar85 -
       fVar171 * fVar171 * fVar146)) * auVar98._12_4_;
  auVar51._0_4_ =
       ~-(uint)((line->primIDs).field_0.i[0] == 0xffffffff) & -(uint)(0.0 <= auVar113._0_4_);
  auVar51._4_4_ =
       ~-(uint)((line->primIDs).field_0.i[1] == 0xffffffff) & -(uint)(0.0 <= auVar113._4_4_);
  auVar51._8_4_ =
       ~-(uint)((line->primIDs).field_0.i[2] == 0xffffffff) & -(uint)(0.0 <= auVar113._8_4_);
  auVar51._12_4_ =
       ~-(uint)((line->primIDs).field_0.i[3] == 0xffffffff) & -(uint)(0.0 <= auVar113._12_4_);
  lVar23 = (ulong)line->leftExists * 0x10;
  lVar27 = (ulong)line->rightExists * 0x10;
  iVar29 = movmskps((int)lVar30,auVar51);
  if (iVar29 != 0) {
    fVar96 = fVar96 - fVar86;
    fVar102 = fVar102 - fVar90;
    fVar104 = fVar104 - fVar92;
    fVar106 = fVar106 - fVar94;
    fVar147 = fVar147 - fVar74;
    fVar148 = fVar148 - fVar77;
    fVar149 = fVar149 - fVar80;
    fVar150 = fVar150 - fVar83;
    auVar112._0_4_ = fVar128 * fVar147;
    auVar112._4_4_ = fVar132 * fVar148;
    auVar112._8_4_ = fVar134 * fVar149;
    auVar112._12_4_ = fVar136 * fVar150;
    fVar39 = fVar39 - fVar164;
    fVar46 = fVar46 - fVar166;
    fVar47 = fVar47 - fVar168;
    fVar48 = fVar48 - fVar170;
    fVar129 = fVar75 * fVar39 + auVar112._0_4_ + fVar151 * fVar96;
    fVar133 = fVar78 * fVar46 + auVar112._4_4_ + fVar153 * fVar102;
    fVar135 = fVar81 * fVar47 + auVar112._8_4_ + fVar154 * fVar104;
    fVar137 = fVar84 * fVar48 + auVar112._12_4_ + fVar155 * fVar106;
    auVar88 = sqrtps(auVar113,auVar113);
    auVar113 = rcpps(auVar112,auVar98);
    fVar74 = auVar113._0_4_;
    fVar77 = auVar113._4_4_;
    fVar80 = auVar113._8_4_;
    fVar83 = auVar113._12_4_;
    uVar34 = -(uint)(1e-18 < ABS(auVar98._0_4_));
    uVar35 = -(uint)(1e-18 < ABS(auVar98._4_4_));
    uVar36 = -(uint)(1e-18 < ABS(auVar98._8_4_));
    uVar37 = -(uint)(1e-18 < ABS(auVar98._12_4_));
    fVar74 = (1.0 - auVar98._0_4_ * fVar74) * fVar74 + fVar74;
    fVar77 = (1.0 - auVar98._4_4_ * fVar77) * fVar77 + fVar77;
    fVar80 = (1.0 - auVar98._8_4_ * fVar80) * fVar80 + fVar80;
    fVar83 = (1.0 - auVar98._12_4_ * fVar83) * fVar83 + fVar83;
    fVar86 = (float)(~uVar34 & 0xff800000 | (uint)((-fVar172 - auVar88._0_4_) * fVar74) & uVar34);
    fVar87 = (float)(~uVar35 & 0xff800000 | (uint)((-fVar173 - auVar88._4_4_) * fVar77) & uVar35);
    fVar90 = (float)(~uVar36 & 0xff800000 | (uint)((-fVar174 - auVar88._8_4_) * fVar80) & uVar36);
    fVar91 = (float)(~uVar37 & 0xff800000 | (uint)((-fVar175 - auVar88._12_4_) * fVar83) & uVar37);
    fVar74 = (float)(~uVar34 & 0x7f800000 | (uint)((auVar88._0_4_ - fVar172) * fVar74) & uVar34);
    fVar77 = (float)(~uVar35 & 0x7f800000 | (uint)((auVar88._4_4_ - fVar173) * fVar77) & uVar35);
    fVar80 = (float)(~uVar36 & 0x7f800000 | (uint)((auVar88._8_4_ - fVar174) * fVar80) & uVar36);
    fVar83 = (float)(~uVar37 & 0x7f800000 | (uint)((auVar88._12_4_ - fVar175) * fVar83) & uVar37);
    fVar164 = fVar157 * fVar86 + fVar165;
    fVar166 = fVar159 * fVar87 + fVar167;
    fVar168 = fVar161 * fVar90 + fVar169;
    fVar170 = fVar163 * fVar91 + fVar171;
    uVar34 = -(uint)(0.0 < fVar164 && fVar164 < (float)local_2d8._0_4_) & auVar51._0_4_;
    uVar35 = -(uint)(0.0 < fVar166 && fVar166 < (float)local_2d8._4_4_) & auVar51._4_4_;
    uVar36 = -(uint)(0.0 < fVar168 && fVar168 < fStack_2d0) & auVar51._8_4_;
    uVar37 = -(uint)(0.0 < fVar170 && fVar170 < fStack_2cc) & auVar51._12_4_;
    auVar140._0_4_ = (uint)fVar86 & uVar34;
    auVar140._4_4_ = (uint)fVar87 & uVar35;
    auVar140._8_4_ = (uint)fVar90 & uVar36;
    auVar140._12_4_ = (uint)fVar91 & uVar37;
    auVar114._0_8_ = CONCAT44(~uVar35,~uVar34) & 0x7f8000007f800000;
    auVar114._8_4_ = ~uVar36 & 0x7f800000;
    auVar114._12_4_ = ~uVar37 & 0x7f800000;
    _local_2f8 = auVar114 | auVar140;
    local_2e8 = fVar157 * fVar74 + fVar165;
    fStack_2e4 = fVar159 * fVar77 + fVar167;
    fStack_2e0 = fVar161 * fVar80 + fVar169;
    fStack_2dc = fVar163 * fVar83 + fVar171;
    auVar60._4_4_ = -(uint)(0.0 < fStack_2e4);
    auVar60._0_4_ = -(uint)(0.0 < local_2e8);
    auVar60._8_4_ = -(uint)(0.0 < fStack_2e0);
    auVar60._12_4_ = -(uint)(0.0 < fStack_2dc);
    uVar34 = -(uint)(local_2e8 < (float)local_2d8._0_4_ && 0.0 < local_2e8) & auVar51._0_4_;
    uVar35 = -(uint)(fStack_2e4 < (float)local_2d8._4_4_ && 0.0 < fStack_2e4) & auVar51._4_4_;
    uVar36 = -(uint)(fStack_2e0 < fStack_2d0 && 0.0 < fStack_2e0) & auVar51._8_4_;
    uVar37 = -(uint)(fStack_2dc < fStack_2cc && 0.0 < fStack_2dc) & auVar51._12_4_;
    auVar40._0_4_ = (uint)fVar74 & uVar34;
    auVar40._4_4_ = (uint)fVar77 & uVar35;
    auVar40._8_4_ = (uint)fVar80 & uVar36;
    auVar40._12_4_ = (uint)fVar83 & uVar37;
    auVar152._0_8_ = CONCAT44(~uVar35,~uVar34) & 0xff800000ff800000;
    auVar152._8_4_ = ~uVar36 & 0xff800000;
    auVar152._12_4_ = ~uVar37 & 0xff800000;
    auVar152 = auVar152 | auVar40;
    auVar19._4_4_ = fVar159;
    auVar19._0_4_ = fVar157;
    auVar19._8_4_ = fVar161;
    auVar19._12_4_ = fVar163;
    auVar98 = rcpps(auVar60,auVar19);
    fVar74 = auVar98._0_4_;
    fVar77 = auVar98._4_4_;
    fVar80 = auVar98._8_4_;
    fVar83 = auVar98._12_4_;
    fVar74 = (1.0 - fVar157 * fVar74) * fVar74 + fVar74;
    fVar77 = (1.0 - fVar159 * fVar77) * fVar77 + fVar77;
    fVar80 = (1.0 - fVar161 * fVar80) * fVar80 + fVar80;
    fVar83 = (1.0 - fVar163 * fVar83) * fVar83 + fVar83;
    fVar92 = fVar157 * fVar138 - fVar49 * fVar165;
    fVar93 = fVar159 * fVar141 - fVar49 * fVar167;
    fVar94 = fVar161 * fVar143 - fVar49 * fVar169;
    fVar95 = fVar163 * fVar145 - fVar49 * fVar171;
    fVar86 = fVar157 * fVar156 - fStack_2b0 * fVar165;
    fVar87 = fVar159 * fVar158 - fStack_2b0 * fVar167;
    fVar90 = fVar161 * fVar160 - fStack_2b0 * fVar169;
    fVar91 = fVar163 * fVar162 - fStack_2b0 * fVar171;
    fVar172 = fVar157 * fVar108 - fVar38 * fVar165;
    fVar173 = fVar159 * fVar116 - fVar38 * fVar167;
    fVar174 = fVar161 * fVar120 - fVar38 * fVar169;
    fVar175 = fVar163 * fVar124 - fVar38 * fVar171;
    uVar34 = -(uint)(fVar109 * fVar109 * fVar110 <=
                    fVar92 * fVar92 + fVar86 * fVar86 + fVar172 * fVar172);
    uVar35 = -(uint)(fVar117 * fVar117 * fVar118 <=
                    fVar93 * fVar93 + fVar87 * fVar87 + fVar173 * fVar173);
    uVar36 = -(uint)(fVar121 * fVar121 * fVar122 <=
                    fVar94 * fVar94 + fVar90 * fVar90 + fVar174 * fVar174);
    uVar37 = -(uint)(fVar125 * fVar125 * fVar126 <=
                    fVar95 * fVar95 + fVar91 * fVar91 + fVar175 * fVar175);
    auVar89._0_4_ =
         (uVar34 & 0x7f800000 | ~uVar34 & (uint)(-fVar165 * fVar74)) &
         ~*(uint *)(mm_lookupmask_ps + lVar23) & auVar51._0_4_;
    auVar89._4_4_ =
         (uVar35 & 0x7f800000 | ~uVar35 & (uint)(-fVar167 * fVar77)) &
         ~*(uint *)(mm_lookupmask_ps + lVar23 + 4) & auVar51._4_4_;
    auVar89._8_4_ =
         (uVar36 & 0x7f800000 | ~uVar36 & (uint)(-fVar169 * fVar80)) &
         ~*(uint *)(mm_lookupmask_ps + lVar23 + 8) & auVar51._8_4_;
    auVar89._12_4_ =
         (uVar37 & 0x7f800000 | ~uVar37 & (uint)(-fVar171 * fVar83)) &
         ~*(uint *)(mm_lookupmask_ps + lVar23 + 0xc) & auVar51._12_4_;
    auVar69._0_8_ =
         CONCAT44(~(~*(uint *)(mm_lookupmask_ps + lVar23 + 4) & auVar51._4_4_),
                  ~(~*(uint *)(mm_lookupmask_ps + lVar23) & auVar51._0_4_)) & 0x7f8000007f800000;
    auVar69._8_4_ = ~(~*(uint *)(mm_lookupmask_ps + lVar23 + 8) & auVar51._8_4_) & 0x7f800000;
    auVar69._12_4_ = ~(~*(uint *)(mm_lookupmask_ps + lVar23 + 0xc) & auVar51._12_4_) & 0x7f800000;
    auVar69 = auVar69 | auVar89;
    fVar86 = fVar96 * fVar157 - fVar49 * fVar129;
    fVar87 = fVar102 * fVar159 - fVar49 * fVar133;
    fVar90 = fVar104 * fVar161 - fVar49 * fVar135;
    fVar91 = fVar106 * fVar163 - fVar49 * fVar137;
    fVar106 = fVar147 * fVar157 - fStack_2b0 * fVar129;
    fVar147 = fVar148 * fVar159 - fStack_2b0 * fVar133;
    fVar148 = fVar149 * fVar161 - fStack_2b0 * fVar135;
    fVar149 = fVar150 * fVar163 - fStack_2b0 * fVar137;
    fVar39 = fVar39 * fVar157 - fVar38 * fVar129;
    fVar46 = fVar46 * fVar159 - fVar38 * fVar133;
    fVar47 = fVar47 * fVar161 - fVar38 * fVar135;
    fVar48 = fVar48 * fVar163 - fVar38 * fVar137;
    fVar150 = *(float *)(ray + k * 4 + 0x30);
    local_388 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar27);
    fStack_384 = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar27) >> 0x20);
    fStack_380 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar27 + 8);
    fStack_37c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar27 + 8) >> 0x20);
    uVar34 = -(uint)(fVar68 * fVar68 * fVar110 <=
                    fVar86 * fVar86 + fVar106 * fVar106 + fVar39 * fVar39);
    uVar35 = -(uint)(fVar71 * fVar71 * fVar118 <=
                    fVar87 * fVar87 + fVar147 * fVar147 + fVar46 * fVar46);
    uVar36 = -(uint)(fVar72 * fVar72 * fVar122 <=
                    fVar90 * fVar90 + fVar148 * fVar148 + fVar47 * fVar47);
    uVar37 = -(uint)(fVar73 * fVar73 * fVar126 <=
                    fVar91 * fVar91 + fVar149 * fVar149 + fVar48 * fVar48);
    auVar99._0_4_ =
         (uVar34 & 0x7f800000 | ~uVar34 & (uint)(-fVar129 * fVar74)) &
         ~(uint)local_388 & auVar51._0_4_;
    auVar99._4_4_ =
         (uVar35 & 0x7f800000 | ~uVar35 & (uint)(-fVar133 * fVar77)) &
         ~(uint)fStack_384 & auVar51._4_4_;
    auVar99._8_4_ =
         (uVar36 & 0x7f800000 | ~uVar36 & (uint)(-fVar135 * fVar80)) &
         ~(uint)fStack_380 & auVar51._8_4_;
    auVar99._12_4_ =
         (uVar37 & 0x7f800000 | ~uVar37 & (uint)(-fVar137 * fVar83)) &
         ~(uint)fStack_37c & auVar51._12_4_;
    auVar61._0_8_ =
         CONCAT44(~(~(uint)fStack_384 & auVar51._4_4_),~(~(uint)local_388 & auVar51._0_4_)) &
         0x7f8000007f800000;
    auVar61._8_4_ = ~(~(uint)fStack_380 & auVar51._8_4_) & 0x7f800000;
    auVar61._12_4_ = ~(~(uint)fStack_37c & auVar51._12_4_) & 0x7f800000;
    auVar98 = minps(auVar69,auVar61 | auVar99);
    auVar88 = maxps(auVar69,auVar61 | auVar99);
    auVar113 = minps(_local_2f8,auVar98);
    fVar68 = auVar113._0_4_;
    fVar71 = auVar113._4_4_;
    fVar72 = auVar113._8_4_;
    fVar73 = auVar113._12_4_;
    fVar48 = auVar98._0_4_;
    fVar106 = auVar98._4_4_;
    fVar39 = auVar98._8_4_;
    fVar46 = auVar98._12_4_;
    uVar34 = -(uint)(auVar88._0_4_ != INFINITY);
    uVar35 = -(uint)(auVar88._4_4_ != INFINITY);
    uVar36 = -(uint)(auVar88._8_4_ != INFINITY);
    uVar37 = -(uint)(auVar88._12_4_ != INFINITY);
    auVar62._0_4_ =
         (~-(uint)(fVar48 != INFINITY) & 0xff800000 | (uint)fVar48 & -(uint)(fVar48 != INFINITY)) &
         -(uint)(fVar68 != fVar48);
    auVar62._4_4_ =
         (~-(uint)(fVar106 != INFINITY) & 0xff800000 | (uint)fVar106 & -(uint)(fVar106 != INFINITY))
         & -(uint)(fVar71 != fVar106);
    auVar62._8_4_ =
         (~-(uint)(fVar39 != INFINITY) & 0xff800000 | (uint)fVar39 & -(uint)(fVar39 != INFINITY)) &
         -(uint)(fVar72 != fVar39);
    auVar62._12_4_ =
         (~-(uint)(fVar46 != INFINITY) & 0xff800000 | (uint)fVar46 & -(uint)(fVar46 != INFINITY)) &
         -(uint)(fVar73 != fVar46);
    auVar100._0_4_ =
         ~-(uint)(fVar68 != fVar48) & (~uVar34 & 0xff800000 | (uint)auVar88._0_4_ & uVar34);
    auVar100._4_4_ =
         ~-(uint)(fVar71 != fVar106) & (~uVar35 & 0xff800000 | (uint)auVar88._4_4_ & uVar35);
    auVar100._8_4_ =
         ~-(uint)(fVar72 != fVar39) & (~uVar36 & 0xff800000 | (uint)auVar88._8_4_ & uVar36);
    auVar100._12_4_ =
         ~-(uint)(fVar73 != fVar46) & (~uVar37 & 0xff800000 | (uint)auVar88._12_4_ & uVar37);
    _local_58 = maxps(auVar152,auVar100 | auVar62);
    fVar48 = *(float *)(ray + k * 4 + 0x80);
    uVar35 = -(uint)((fVar150 <= fVar50 + fVar68 && fVar50 + fVar68 <= fVar48) && fVar68 != INFINITY
                    );
    uVar36 = -(uint)((fVar150 <= fVar57 + fVar71 && fVar57 + fVar71 <= fVar48) && fVar71 != INFINITY
                    );
    uVar37 = -(uint)((fVar150 <= fStack_2c0 + fVar72 && fStack_2c0 + fVar72 <= fVar48) &&
                    fVar72 != INFINITY);
    uVar58 = -(uint)((fVar150 <= fStack_2bc + fVar73 && fStack_2bc + fVar73 <= fVar48) &&
                    fVar73 != INFINITY);
    fVar106 = local_58._0_4_;
    local_2a8 = fVar50 + fVar106;
    fVar39 = local_58._4_4_;
    fStack_2a4 = fVar57 + fVar39;
    fVar46 = local_58._8_4_;
    fStack_2a0 = fStack_2c0 + fVar46;
    fVar47 = local_58._12_4_;
    fStack_29c = fStack_2bc + fVar47;
    uVar97 = uVar35 & auVar51._0_4_;
    uVar103 = uVar36 & auVar51._4_4_;
    auVar41._4_4_ = uVar103;
    auVar41._0_4_ = uVar97;
    uVar105 = uVar37 & auVar51._8_4_;
    uVar107 = uVar58 & auVar51._12_4_;
    local_48._0_4_ =
         -(uint)(fVar106 != -INFINITY) & auVar51._0_4_ &
         -(uint)(local_2a8 <= fVar48 && fVar150 <= local_2a8);
    local_48._4_4_ =
         -(uint)(fVar39 != -INFINITY) & auVar51._4_4_ &
         -(uint)(fStack_2a4 <= fVar48 && fVar150 <= fStack_2a4);
    local_48._8_4_ =
         -(uint)(fVar46 != -INFINITY) & auVar51._8_4_ &
         -(uint)(fStack_2a0 <= fVar48 && fVar150 <= fStack_2a0);
    local_48._12_4_ =
         -(uint)(fVar47 != -INFINITY) & auVar51._12_4_ &
         -(uint)(fStack_29c <= fVar48 && fVar150 <= fStack_29c);
    auVar41._8_4_ = uVar105;
    auVar41._12_4_ = uVar107;
    uVar34 = movmskps((int)lVar23,auVar41 | local_48);
    if (uVar34 != 0) {
      fVar90 = (float)((uint)fVar68 & uVar97 | ~uVar97 & (uint)fVar106);
      fVar91 = (float)((uint)fVar71 & uVar103 | ~uVar103 & (uint)fVar39);
      fVar92 = (float)((uint)fVar72 & uVar105 | ~uVar105 & (uint)fVar46);
      fVar93 = (float)((uint)fVar73 & uVar107 | ~uVar107 & (uint)fVar47);
      auVar42._0_4_ = (uint)fVar164 & uVar97;
      auVar42._4_4_ = (uint)fVar166 & uVar103;
      auVar42._8_4_ = (uint)fVar168 & uVar105;
      auVar42._12_4_ = (uint)fVar170 & uVar107;
      auVar101._0_4_ = ~uVar97 & (uint)local_2e8;
      auVar101._4_4_ = ~uVar103 & (uint)fStack_2e4;
      auVar101._8_4_ = ~uVar105 & (uint)fStack_2e0;
      auVar101._12_4_ = ~uVar107 & (uint)fStack_2dc;
      auVar101 = auVar101 | auVar42;
      auVar98 = rcpps(auVar42,_local_2d8);
      fVar150 = auVar98._0_4_;
      fVar106 = auVar98._4_4_;
      fVar39 = auVar98._8_4_;
      fVar46 = auVar98._12_4_;
      fVar150 = (1.0 - (float)local_2d8._0_4_ * fVar150) * fVar150 + fVar150;
      fVar106 = (1.0 - (float)local_2d8._4_4_ * fVar106) * fVar106 + fVar106;
      fVar39 = (1.0 - fStack_2d0 * fVar39) * fVar39 + fVar39;
      fVar46 = (1.0 - fStack_2cc * fVar46) * fVar46 + fVar46;
      fVar109 = fVar109 * fVar59 * (float)local_2d8._0_4_;
      fVar117 = fVar117 * fVar65 * (float)local_2d8._4_4_;
      fVar121 = fVar121 * fVar66 * fStack_2d0;
      fVar125 = fVar125 * fVar67 * fStack_2cc;
      fVar149 = fVar128 * fVar109;
      fVar83 = fVar132 * fVar117;
      fVar86 = fVar134 * fVar121;
      fVar87 = fVar136 * fVar125;
      fVar73 = fVar109 * fVar75;
      fVar74 = fVar117 * fVar78;
      fVar147 = fVar121 * fVar81;
      fVar77 = fVar125 * fVar84;
      fVar67 = fVar139 * fVar75;
      fVar68 = fVar142 * fVar78;
      fVar71 = fVar144 * fVar81;
      fVar72 = fVar146 * fVar84;
      local_388 = auVar152._0_4_;
      fStack_384 = auVar152._4_4_;
      fStack_380 = auVar152._8_4_;
      fStack_37c = auVar152._12_4_;
      uVar97 = -(uint)(fVar90 == local_388 || fVar90 == (float)local_2f8._0_4_) & auVar51._0_4_;
      uVar103 = -(uint)(fVar91 == fStack_384 || fVar91 == (float)local_2f8._4_4_) & auVar51._4_4_;
      uVar105 = -(uint)(fVar92 == fStack_380 || fVar92 == fStack_2f0) & auVar51._8_4_;
      uVar107 = -(uint)(fVar93 == fStack_37c || fVar93 == fStack_2ec) & auVar51._12_4_;
      uVar111 = -(uint)(fVar90 == auVar69._0_4_) & auVar51._0_4_;
      uVar119 = -(uint)(fVar91 == auVar69._4_4_) & auVar51._4_4_;
      uVar123 = -(uint)(fVar92 == auVar69._8_4_) & auVar51._8_4_;
      uVar127 = -(uint)(fVar93 == auVar69._12_4_) & auVar51._12_4_;
      local_68 = fVar151 * fVar109;
      fStack_64 = fVar153 * fVar117;
      fStack_60 = fVar154 * fVar121;
      fStack_5c = fVar155 * fVar125;
      local_88 = fVar151 * fVar139;
      fStack_84 = fVar153 * fVar142;
      fStack_80 = fVar154 * fVar144;
      fStack_7c = fVar155 * fVar146;
      fVar47 = auVar101._0_4_;
      fVar59 = auVar101._4_4_;
      fVar65 = auVar101._8_4_;
      fVar66 = auVar101._12_4_;
      local_78 = fVar128 * fVar139;
      fStack_74 = fVar132 * fVar142;
      fStack_70 = fVar134 * fVar144;
      fStack_6c = fVar136 * fVar146;
      local_98 = -fVar151;
      fStack_94 = -fVar153;
      fStack_90 = -fVar154;
      fStack_8c = -fVar155;
      local_a8 = -fVar128;
      fStack_a4 = -fVar132;
      fStack_a0 = -fVar134;
      fStack_9c = -fVar136;
      fVar148 = -fVar81;
      fVar80 = -fVar84;
      local_378 = CONCAT44(fVar78,fVar75) ^ 0x8000000080000000;
      auVar115._0_4_ = ~uVar97 & ((uint)-fVar151 & uVar111 | ~uVar111 & (uint)fVar151);
      auVar115._4_4_ = ~uVar103 & ((uint)-fVar153 & uVar119 | ~uVar119 & (uint)fVar153);
      auVar115._8_4_ = ~uVar105 & ((uint)-fVar154 & uVar123 | ~uVar123 & (uint)fVar154);
      auVar115._12_4_ = ~uVar107 & ((uint)-fVar155 & uVar127 | ~uVar127 & (uint)fVar155);
      auVar63._0_4_ =
           (uint)(((fVar49 * fVar90 + fVar138) * fVar76 + fVar151 * fVar109) -
                 fVar151 * fVar139 * fVar47) & uVar97;
      auVar63._4_4_ =
           (uint)(((fVar49 * fVar91 + fVar141) * fVar79 + fVar153 * fVar117) -
                 fVar153 * fVar142 * fVar59) & uVar103;
      auVar63._8_4_ =
           (uint)(((fVar49 * fVar92 + fVar143) * fVar82 + fVar154 * fVar121) -
                 fVar154 * fVar144 * fVar65) & uVar105;
      auVar63._12_4_ =
           (uint)(((fVar49 * fVar93 + fVar145) * fVar85 + fVar155 * fVar125) -
                 fVar155 * fVar146 * fVar66) & uVar107;
      hit.vt.field_0.v[0] = fVar50 + fVar90;
      hit.vt.field_0.v[1] = fVar57 + fVar91;
      hit.vt.field_0.v[2] = fStack_2c0 + fVar92;
      hit.vt.field_0.v[3] = fStack_2bc + fVar93;
      hit.vu.field_0.i[0] = ~uVar97 & ~uVar111 & 0x3f800000 | (uint)(fVar47 * fVar150) & uVar97;
      hit.vu.field_0.i[1] = ~uVar103 & ~uVar119 & 0x3f800000 | (uint)(fVar59 * fVar106) & uVar103;
      hit.vu.field_0.i[2] = ~uVar105 & ~uVar123 & 0x3f800000 | (uint)(fVar65 * fVar39) & uVar105;
      hit.vu.field_0.i[3] = ~uVar107 & ~uVar127 & 0x3f800000 | (uint)(fVar66 * fVar46) & uVar107;
      hit.vv.field_0._0_8_ = 0;
      hit.vv.field_0._8_8_ = 0;
      hit.vNg.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)(auVar63 | auVar115);
      hit.vNg.field_0._20_4_ =
           (uint)(((fStack_2b0 * fVar91 + fVar158) * fVar79 + fVar83) - fVar132 * fVar142 * fVar59)
           & uVar103 | ~uVar103 & ((uint)-fVar132 & uVar119 | ~uVar119 & (uint)fVar132);
      hit.vNg.field_0._16_4_ =
           (uint)(((fStack_2b0 * fVar90 + fVar156) * fVar76 + fVar149) - fVar128 * fVar139 * fVar47)
           & uVar97 | ~uVar97 & ((uint)-fVar128 & uVar111 | ~uVar111 & (uint)fVar128);
      hit.vNg.field_0._24_4_ =
           (uint)(((fStack_2b0 * fVar92 + fVar160) * fVar82 + fVar86) - fVar134 * fVar144 * fVar65)
           & uVar105 | ~uVar105 & ((uint)-fVar134 & uVar123 | ~uVar123 & (uint)fVar134);
      hit.vNg.field_0._28_4_ =
           (uint)(((fStack_2b0 * fVar93 + fVar162) * fVar85 + fVar87) - fVar136 * fVar146 * fVar66)
           & uVar107 | ~uVar107 & ((uint)-fVar136 & uVar127 | ~uVar127 & (uint)fVar136);
      hit.vNg.field_0._36_4_ =
           (uint)(((fVar38 * fVar91 + fVar116) * fVar79 + fVar74) - fVar68 * fVar59) & uVar103 |
           ~uVar103 & ((uint)-fVar78 & uVar119 | ~uVar119 & (uint)fVar78);
      hit.vNg.field_0._32_4_ =
           (uint)(((fVar38 * fVar90 + fVar108) * fVar76 + fVar73) - fVar67 * fVar47) & uVar97 |
           ~uVar97 & ((uint)-fVar75 & uVar111 | ~uVar111 & (uint)fVar75);
      hit.vNg.field_0._40_4_ =
           (uint)(((fVar38 * fVar92 + fVar120) * fVar82 + fVar147) - fVar71 * fVar65) & uVar105 |
           ~uVar105 & ((uint)fVar148 & uVar123 | ~uVar123 & (uint)fVar81);
      hit.vNg.field_0._44_4_ =
           (uint)(((fVar38 * fVar93 + fVar124) * fVar85 + fVar77) - fVar72 * fVar66) & uVar107 |
           ~uVar107 & ((uint)fVar80 & uVar127 | ~uVar127 & (uint)fVar84);
      uVar33 = (ulong)(uVar34 & 0xff);
      lVar30 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      pSVar31 = local_300;
      _local_2d8 = auVar69;
      fStack_2ac = fStack_2b0;
      local_298 = fVar156;
      fStack_294 = fVar158;
      fStack_290 = fVar160;
      fStack_28c = fVar162;
      local_288 = fVar138;
      fStack_284 = fVar141;
      fStack_280 = fVar143;
      fStack_27c = fVar145;
      local_278 = fVar75;
      fStack_274 = fVar78;
      fStack_270 = fVar81;
      fStack_26c = fVar84;
      local_268 = fVar128;
      fStack_264 = fVar132;
      fStack_260 = fVar134;
      fStack_25c = fVar136;
      do {
        uVar18 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        local_d8 = local_148[uVar18];
        pGVar17 = (pSVar31->geometries).items[local_d8].ptr;
        pRVar24 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
        if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          pRVar24 = context->args;
          if ((pRVar24->filter == (RTCFilterFunctionN)0x0) &&
             (bVar28 = true, pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_0034931c;
          local_108 = hit.vu.field_0.v[uVar18];
          iVar29 = hit.vv.field_0.i[uVar18];
          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[uVar18];
          args.context = context->user;
          local_e8 = (line->primIDs).field_0.i[uVar18];
          local_f8._4_4_ = iVar29;
          local_f8._0_4_ = iVar29;
          local_f8._8_4_ = iVar29;
          local_f8._12_4_ = iVar29;
          local_138 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar18 * 4);
          local_128 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar18 * 4 + 0x10);
          local_118 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar18 * 4 + 0x20);
          uStack_134 = local_138;
          uStack_130 = local_138;
          uStack_12c = local_138;
          uStack_124 = local_128;
          uStack_120 = local_128;
          uStack_11c = local_128;
          uStack_114 = local_118;
          uStack_110 = local_118;
          uStack_10c = local_118;
          fStack_104 = local_108;
          fStack_100 = local_108;
          fStack_fc = local_108;
          uStack_e4 = local_e8;
          uStack_e0 = local_e8;
          uStack_dc = local_e8;
          uStack_d4 = local_d8;
          uStack_d0 = local_d8;
          uStack_cc = local_d8;
          uStack_c4 = (args.context)->instID[0];
          local_c8 = uStack_c4;
          uStack_c0 = uStack_c4;
          uStack_bc = uStack_c4;
          uStack_b4 = (args.context)->instPrimID[0];
          local_b8 = uStack_b4;
          uStack_b0 = uStack_b4;
          uStack_ac = uStack_b4;
          local_318 = *(int *)(mm_lookupmask_ps + lVar30);
          iStack_314 = *(int *)(mm_lookupmask_ps + lVar30 + 4);
          iStack_310 = *(int *)(mm_lookupmask_ps + lVar30 + 8);
          iStack_30c = *(int *)(mm_lookupmask_ps + lVar30 + 0xc);
          args.valid = &local_318;
          args.geometryUserPtr = pGVar17->userPtr;
          args.hit = (RTCHitN *)&local_138;
          args.N = 4;
          p_Var25 = pGVar17->occlusionFilterN;
          args.ray = (RTCRayN *)ray;
          if (p_Var25 != (RTCFilterFunctionN)0x0) {
            local_2c8 = ray;
            p_Var25 = (RTCFilterFunctionN)(*p_Var25)(&args);
            pSVar31 = local_300;
            ray = local_2c8;
            fVar156 = local_298;
            fVar158 = fStack_294;
            fVar160 = fStack_290;
            fVar162 = fStack_28c;
            fVar128 = local_268;
            fVar132 = fStack_264;
            fVar134 = fStack_260;
            fVar136 = fStack_25c;
            fVar75 = local_278;
            fVar78 = fStack_274;
            fVar81 = fStack_270;
            fVar84 = fStack_26c;
            fVar138 = local_288;
            fVar141 = fStack_284;
            fVar143 = fStack_280;
            fVar145 = fStack_27c;
          }
          auVar52._0_4_ = -(uint)(local_318 == 0);
          auVar52._4_4_ = -(uint)(iStack_314 == 0);
          auVar52._8_4_ = -(uint)(iStack_310 == 0);
          auVar52._12_4_ = -(uint)(iStack_30c == 0);
          uVar34 = movmskps((int)p_Var25,auVar52);
          pRVar26 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
          if ((uVar34 ^ 0xf) == 0) {
            auVar52 = auVar52 ^ _DAT_01f46b70;
          }
          else {
            p_Var25 = context->args->filter;
            if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var25)(&args);
              pSVar31 = local_300;
              fVar156 = local_298;
              fVar158 = fStack_294;
              fVar160 = fStack_290;
              fVar162 = fStack_28c;
              fVar128 = local_268;
              fVar132 = fStack_264;
              fVar134 = fStack_260;
              fVar136 = fStack_25c;
              fVar75 = local_278;
              fVar78 = fStack_274;
              fVar81 = fStack_270;
              fVar84 = fStack_26c;
              fVar138 = local_288;
              fVar141 = fStack_284;
              fVar143 = fStack_280;
              fVar145 = fStack_27c;
            }
            auVar43._0_4_ = -(uint)(local_318 == 0);
            auVar43._4_4_ = -(uint)(iStack_314 == 0);
            auVar43._8_4_ = -(uint)(iStack_310 == 0);
            auVar43._12_4_ = -(uint)(iStack_30c == 0);
            auVar52 = auVar43 ^ _DAT_01f46b70;
            *(undefined1 (*) [16])(args.ray + 0x80) =
                 ~auVar43 & _DAT_01f45a40 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar43;
            pRVar26 = args.ray;
          }
          auVar53._0_4_ = auVar52._0_4_ << 0x1f;
          auVar53._4_4_ = auVar52._4_4_ << 0x1f;
          auVar53._8_4_ = auVar52._8_4_ << 0x1f;
          auVar53._12_4_ = auVar52._12_4_ << 0x1f;
          uVar34 = movmskps((int)pRVar26,auVar53);
          pRVar24 = (RTCIntersectArguments *)(ulong)uVar34;
          if (uVar34 != 0) {
            fVar48 = *(float *)(ray + k * 4 + 0x80);
            bVar28 = true;
            goto LAB_003492f2;
          }
          *(float *)(ray + k * 4 + 0x80) = fVar48;
        }
        uVar33 = uVar33 ^ 1L << (uVar18 & 0x3f);
      } while (uVar33 != 0);
      bVar28 = false;
LAB_003492f2:
LAB_0034931c:
      auVar44._0_4_ = uVar35 & local_48._0_4_ & -(uint)(local_2a8 <= fVar48);
      auVar44._4_4_ = uVar36 & local_48._4_4_ & -(uint)(fStack_2a4 <= fVar48);
      auVar44._8_4_ = uVar37 & local_48._8_4_ & -(uint)(fStack_2a0 <= fVar48);
      auVar44._12_4_ = uVar58 & local_48._12_4_ & -(uint)(fStack_29c <= fVar48);
      uVar34 = movmskps((int)pRVar24,auVar44);
      if (uVar34 == 0) {
        return bVar28;
      }
      uVar97 = -(uint)((float)local_2f8._0_4_ != (float)local_58._0_4_ &&
                      local_388 != (float)local_58._0_4_);
      uVar103 = -(uint)((float)local_2f8._4_4_ != (float)local_58._4_4_ &&
                       fStack_384 != (float)local_58._4_4_);
      uVar105 = -(uint)(fStack_2f0 != fStack_50 && fStack_380 != fStack_50);
      uVar107 = -(uint)(fStack_2ec != fStack_4c && fStack_37c != fStack_4c);
      uVar35 = -(uint)((float)local_2d8._0_4_ != (float)local_58._0_4_);
      uVar36 = -(uint)((float)local_2d8._4_4_ != (float)local_58._4_4_);
      uVar37 = -(uint)(fStack_2d0 != fStack_50);
      uVar58 = -(uint)(fStack_2cc != fStack_4c);
      auVar54._0_4_ =
           ~uVar97 & (uint)((fVar149 + (fVar156 + (float)local_2b8 * (float)local_58._0_4_) * fVar76
                            ) - local_78 * local_2e8);
      auVar54._4_4_ =
           ~uVar103 &
           (uint)((fVar83 + (fVar158 + local_2b8._4_4_ * (float)local_58._4_4_) * fVar79) -
                 fStack_74 * fStack_2e4);
      auVar54._8_4_ =
           ~uVar105 &
           (uint)((fVar86 + (fVar160 + fStack_2b0 * fStack_50) * fVar82) - fStack_70 * fStack_2e0);
      auVar54._12_4_ =
           ~uVar107 &
           (uint)((fVar87 + (fVar162 + fStack_2ac * fStack_4c) * fVar85) - fStack_6c * fStack_2dc);
      auVar130._0_4_ = ((uint)fVar128 & uVar35 | ~uVar35 & (uint)local_a8) & uVar97;
      auVar130._4_4_ = ((uint)fVar132 & uVar36 | ~uVar36 & (uint)fStack_a4) & uVar103;
      auVar130._8_4_ = ((uint)fVar134 & uVar37 | ~uVar37 & (uint)fStack_a0) & uVar105;
      auVar130._12_4_ = ((uint)fVar136 & uVar58 | ~uVar58 & (uint)fStack_9c) & uVar107;
      auVar64._0_4_ =
           ~uVar97 & (uint)((fVar73 + (fVar108 + fVar38 * (float)local_58._0_4_) * fVar76) -
                           fVar67 * local_2e8);
      auVar64._4_4_ =
           ~uVar103 &
           (uint)((fVar74 + (fVar116 + fVar38 * (float)local_58._4_4_) * fVar79) -
                 fVar68 * fStack_2e4);
      auVar64._8_4_ =
           ~uVar105 &
           (uint)((fVar147 + (fVar120 + fVar38 * fStack_50) * fVar82) - fVar71 * fStack_2e0);
      auVar64._12_4_ =
           ~uVar107 &
           (uint)((fVar77 + (fVar124 + fVar38 * fStack_4c) * fVar85) - fVar72 * fStack_2dc);
      auVar70._0_4_ = (~uVar35 & (uint)local_378 | (uint)fVar75 & uVar35) & uVar97;
      auVar70._4_4_ = (~uVar36 & local_378._4_4_ | (uint)fVar78 & uVar36) & uVar103;
      auVar70._8_4_ = (~uVar37 & (uint)fVar148 | (uint)fVar81 & uVar37) & uVar105;
      auVar70._12_4_ = (~uVar58 & (uint)fVar80 | (uint)fVar84 & uVar58) & uVar107;
      hit.vu.field_0.i[0] = ~uVar97 & (uint)(fVar150 * local_2e8) | ~uVar111 & 0x3f800000 & uVar97;
      hit.vu.field_0.i[1] =
           ~uVar103 & (uint)(fVar106 * fStack_2e4) | ~uVar119 & 0x3f800000 & uVar103;
      hit.vu.field_0.i[2] = ~uVar105 & (uint)(fVar39 * fStack_2e0) | ~uVar123 & 0x3f800000 & uVar105
      ;
      hit.vu.field_0.i[3] = ~uVar107 & (uint)(fVar46 * fStack_2dc) | ~uVar127 & 0x3f800000 & uVar107
      ;
      hit.vv.field_0._0_8_ = 0;
      hit.vv.field_0._8_8_ = 0;
      hit.vt.field_0.v[1] = fStack_2a4;
      hit.vt.field_0.v[0] = local_2a8;
      hit.vt.field_0.v[2] = fStack_2a0;
      hit.vt.field_0.v[3] = fStack_29c;
      hit.vNg.field_0._4_4_ =
           ~uVar103 &
           (uint)((fStack_64 + (fVar141 + fVar49 * (float)local_58._4_4_) * fVar79) -
                 fStack_84 * fStack_2e4) |
           ((uint)fVar153 & uVar36 | ~uVar36 & (uint)fStack_94) & uVar103;
      hit.vNg.field_0._0_4_ =
           ~uVar97 & (uint)((local_68 + (fVar138 + fVar49 * (float)local_58._0_4_) * fVar76) -
                           local_88 * local_2e8) |
           ((uint)fVar151 & uVar35 | ~uVar35 & (uint)local_98) & uVar97;
      hit.vNg.field_0._8_4_ =
           ~uVar105 &
           (uint)((fStack_60 + (fVar143 + fVar49 * fStack_50) * fVar82) - fStack_80 * fStack_2e0) |
           ((uint)fVar154 & uVar37 | ~uVar37 & (uint)fStack_90) & uVar105;
      hit.vNg.field_0._12_4_ =
           ~uVar107 &
           (uint)((fStack_5c + (fVar145 + fVar49 * fStack_4c) * fVar85) - fStack_7c * fStack_2dc) |
           ((uint)fVar155 & uVar58 | ~uVar58 & (uint)fStack_8c) & uVar107;
      hit.vNg.field_0.field_0.y.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)(auVar54 | auVar130);
      hit.vNg.field_0.field_0.z.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)(auVar64 | auVar70);
      pSVar31 = context->scene;
      uVar33 = (ulong)(uVar34 & 0xff);
      auVar131._8_4_ = 0xffffffff;
      auVar131._0_8_ = 0xffffffffffffffff;
      auVar131._12_4_ = 0xffffffff;
      do {
        uVar18 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        local_d8 = local_148[uVar18];
        pGVar17 = (pSVar31->geometries).items[local_d8].ptr;
        if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar22 = 1, pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0034972e;
          local_108 = hit.vu.field_0.v[uVar18];
          iVar29 = hit.vv.field_0.i[uVar18];
          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[uVar18];
          args.context = context->user;
          local_e8 = (line->primIDs).field_0.i[uVar18];
          local_f8._4_4_ = iVar29;
          local_f8._0_4_ = iVar29;
          local_f8._8_4_ = iVar29;
          local_f8._12_4_ = iVar29;
          local_138 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar18 * 4);
          local_128 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar18 * 4 + 0x10);
          local_118 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar18 * 4 + 0x20);
          uStack_134 = local_138;
          uStack_130 = local_138;
          uStack_12c = local_138;
          uStack_124 = local_128;
          uStack_120 = local_128;
          uStack_11c = local_128;
          uStack_114 = local_118;
          uStack_110 = local_118;
          uStack_10c = local_118;
          fStack_104 = local_108;
          fStack_100 = local_108;
          fStack_fc = local_108;
          uStack_e4 = local_e8;
          uStack_e0 = local_e8;
          uStack_dc = local_e8;
          uStack_d4 = local_d8;
          uStack_d0 = local_d8;
          uStack_cc = local_d8;
          uStack_c4 = (args.context)->instID[0];
          local_c8 = uStack_c4;
          uStack_c0 = uStack_c4;
          uStack_bc = uStack_c4;
          uStack_b4 = (args.context)->instPrimID[0];
          local_b8 = uStack_b4;
          uStack_b0 = uStack_b4;
          uStack_ac = uStack_b4;
          local_318 = *(int *)(mm_lookupmask_ps + lVar30);
          iStack_314 = *(int *)(mm_lookupmask_ps + lVar30 + 4);
          iStack_310 = *(int *)(mm_lookupmask_ps + lVar30 + 8);
          iStack_30c = *(int *)(mm_lookupmask_ps + lVar30 + 0xc);
          args.valid = &local_318;
          args.geometryUserPtr = pGVar17->userPtr;
          args.hit = (RTCHitN *)&local_138;
          args.N = 4;
          p_Var25 = pGVar17->occlusionFilterN;
          args.ray = (RTCRayN *)ray;
          if (p_Var25 != (RTCFilterFunctionN)0x0) {
            local_2c8 = ray;
            p_Var25 = (RTCFilterFunctionN)(*p_Var25)(&args);
            auVar131._8_4_ = 0xffffffff;
            auVar131._0_8_ = 0xffffffffffffffff;
            auVar131._12_4_ = 0xffffffff;
            ray = local_2c8;
          }
          auVar55._0_4_ = -(uint)(local_318 == 0);
          auVar55._4_4_ = -(uint)(iStack_314 == 0);
          auVar55._8_4_ = -(uint)(iStack_310 == 0);
          auVar55._12_4_ = -(uint)(iStack_30c == 0);
          uVar34 = movmskps((int)p_Var25,auVar55);
          pRVar26 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
          if ((uVar34 ^ 0xf) == 0) {
            auVar55 = auVar55 ^ auVar131;
          }
          else {
            p_Var25 = context->args->filter;
            if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var25)(&args);
              auVar131._8_4_ = 0xffffffff;
              auVar131._0_8_ = 0xffffffffffffffff;
              auVar131._12_4_ = 0xffffffff;
            }
            auVar45._0_4_ = -(uint)(local_318 == 0);
            auVar45._4_4_ = -(uint)(iStack_314 == 0);
            auVar45._8_4_ = -(uint)(iStack_310 == 0);
            auVar45._12_4_ = -(uint)(iStack_30c == 0);
            auVar55 = auVar45 ^ auVar131;
            *(undefined1 (*) [16])(args.ray + 0x80) =
                 ~auVar45 & _DAT_01f45a40 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar45;
            pRVar26 = args.ray;
          }
          auVar56._0_4_ = auVar55._0_4_ << 0x1f;
          auVar56._4_4_ = auVar55._4_4_ << 0x1f;
          auVar56._8_4_ = auVar55._8_4_ << 0x1f;
          auVar56._12_4_ = auVar55._12_4_ << 0x1f;
          iVar29 = movmskps((int)pRVar26,auVar56);
          if (iVar29 != 0) {
            bVar22 = 1;
            goto LAB_0034972e;
          }
          *(float *)(ray + k * 4 + 0x80) = fVar48;
        }
        uVar33 = uVar33 ^ 1L << (uVar18 & 0x3f);
        if (uVar33 == 0) {
          bVar22 = 0;
LAB_0034972e:
          return (bool)(bVar28 | bVar22);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }